

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<unsigned_long> __thiscall
kj::HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>::
insert<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Entry,kj::Path&>
          (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
           *this,ArrayPtr<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Entry>
                 table,size_t pos,Path *params)

{
  size_t *psVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar7;
  HashBucket *pHVar8;
  HashBucket *s;
  HashBucket *pHVar9;
  Entry *this_00;
  ulong targetSize;
  Array<kj::String> *in_R9;
  Disposer *pDVar10;
  Maybe<unsigned_long> MVar11;
  
  this_00 = table.ptr;
  uVar3 = (long)(this_00->value).dir.disposer * 2;
  if (uVar3 < ((this_00->key).parts.size_ + pos) * 3 + 3) {
    targetSize = pos * 2 + 2;
    if (targetSize < uVar3) {
      targetSize = uVar3;
    }
    HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>::
    rehash((HashIndex<kj::HashMap<kj::Path,_capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
            *)this_00,targetSize);
  }
  uVar5 = hashCode<kj::Array<kj::String>const&>(in_R9);
  uVar6 = kj::_::chooseBucket((uint)(uVar5 != 0),*(uint *)&(this_00->value).dir.disposer);
  pHVar9 = (HashBucket *)0x0;
  aVar7 = extraout_RDX;
  do {
    pHVar8 = ((Array<kj::_::HashBucket> *)&(this_00->key).parts.disposer)->ptr + uVar6;
    uVar2 = pHVar8->value;
    if (uVar2 == 1) {
      if (pHVar9 == (HashBucket *)0x0) {
        pHVar9 = pHVar8;
      }
    }
    else {
      if (uVar2 == 0) {
        if (pHVar9 != (HashBucket *)0x0) {
          psVar1 = &(this_00->key).parts.size_;
          *psVar1 = *psVar1 - 1;
          pHVar8 = pHVar9;
        }
        *pHVar8 = (HashBucket)(((ulong)(uVar5 != 0) | (long)params << 0x20) + 0x200000000);
        *this = (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
                 )0x0;
        goto LAB_001deac9;
      }
      if (pHVar8->hash == (uint)(uVar5 != 0)) {
        bVar4 = HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks::
                matches<kj::Path&>((Callbacks *)this_00,
                                   (Entry *)((ulong)(uVar2 - 2) * 0x30 + table.size_),(Path *)in_R9)
        ;
        aVar7 = extraout_RDX_00;
        if (bVar4) {
          uVar5 = pHVar8->value;
          *this = (HashIndex<kj::HashMap<kj::Path,capnp::compiler::CompilerMain::SourceDirectory>::Callbacks>
                   )0x1;
          *(ulong *)(this + 8) = (ulong)(uVar5 - 2);
LAB_001deac9:
          MVar11.ptr.field_1.value = aVar7.value;
          MVar11.ptr._0_8_ = this;
          return (Maybe<unsigned_long>)MVar11.ptr;
        }
      }
    }
    pDVar10 = (Disposer *)((ulong)uVar6 + 1);
    uVar6 = 0;
    if (pDVar10 != (this_00->value).dir.disposer) {
      uVar6 = (uint)pDVar10;
    }
  } while( true );
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    if (buckets.size() * 2 < (table.size() + 1 + erasedCount) * 3) {
      // Load factor is more than 2/3, let's rehash.
      rehash(kj::max(buckets.size() * 2, (table.size() + 1) * 2));
    }

    uint hashCode = cb.hashCode(params...);
    Maybe<_::HashBucket&> erasedSlot;
    for (uint i = _::chooseBucket(hashCode, buckets.size());; i = _::probeHash(buckets, i)) {
      auto& bucket = buckets[i];
      if (bucket.isEmpty()) {
        // no duplicates found
        KJ_IF_MAYBE(s, erasedSlot) {
          --erasedCount;
          *s = { hashCode, uint(pos) };
        } else {
          bucket = { hashCode, uint(pos) };
        }
        return nullptr;
      } else if (bucket.isErased()) {
        // We can fill in the erased slot. However, we have to keep searching to make sure there
        // are no duplicates before we do that.
        if (erasedSlot == nullptr) {
          erasedSlot = bucket;
        }
      } else if (bucket.hash == hashCode &&
                 cb.matches(bucket.getRow(table), params...)) {
        // duplicate row
        return size_t(bucket.getPos());
      }
    }